

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_ocean_shore.c
# Opt level: O1

OceanWave * InitializeWave(double SR,float attackInSeconds,float maxLevel,float positionLeftRight)

{
  OceanWave *__s;
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  float fVar5;
  
  __s = (OceanWave *)PaUtil_AllocateMemory(0x250);
  if (__s != (OceanWave *)0x0) {
    lVar2 = (long)(int)InitializeWave::lastNoOfRows;
    bVar1 = (byte)InitializeWave::lastNoOfRows;
    iVar3 = InitializeWave::lastNoOfRows * 0x800000;
    (__s->wave_left).pink_Index = 0;
    (__s->wave_left).pink_IndexMask = ~(-1 << (bVar1 & 0x1f));
    (__s->wave_left).pink_Scalar = 1.0 / (float)(iVar3 + 0x800000);
    if (0 < lVar2) {
      memset(__s,0,lVar2 << 3);
    }
    (__s->wave_left).pink_RunningSum = 0;
    do {
      iVar3 = rand();
      uVar4 = ((int)((long)(iVar3 << 3) * 0x40000001 >> 0x3d) - ((iVar3 << 3) >> 0x1f)) + 0xc;
    } while (uVar4 == InitializeWave::lastNoOfRows);
    (__s->wave_right).pink_Index = 0;
    (__s->wave_right).pink_IndexMask = ~(-1 << ((byte)uVar4 & 0x1f));
    (__s->wave_right).pink_Scalar = 1.0 / (float)(int)(uVar4 * 0x800000 + 0x800000);
    memset(&__s->wave_right,0,(ulong)uVar4 << 3);
    (__s->wave_right).pink_RunningSum = 0;
    InitializeWave::lastNoOfRows = uVar4;
    __s->wave_envelope_state = State_kAttack;
    __s->wave_envelope_level = 0.0;
    __s->wave_envelope_max_level = maxLevel;
    __s->wave_attack_incr = maxLevel / ((float)SR * attackInSeconds);
    __s->wave_decay_incr = maxLevel / (attackInSeconds * -4.0 * (float)SR);
    fVar5 = 1.0 - positionLeftRight;
    if (fVar5 < 0.0) {
      fVar5 = sqrtf(fVar5);
    }
    else {
      fVar5 = SQRT(fVar5);
    }
    __s->wave_pan_left = fVar5;
    if (positionLeftRight < 0.0) {
      fVar5 = sqrtf(positionLeftRight);
    }
    else {
      fVar5 = SQRT(positionLeftRight);
    }
    __s->wave_pan_right = fVar5;
  }
  return __s;
}

Assistant:

OceanWave* InitializeWave(double SR, float attackInSeconds, float maxLevel, float positionLeftRight)
{
    OceanWave* wave = NULL;
    static unsigned lastNoOfRows = 12;
    unsigned newNoOfRows;

    wave = (OceanWave*)PaUtil_AllocateMemory(sizeof(OceanWave));
    if (wave != NULL)
    {
        InitializePinkNoise(&wave->wave_left, lastNoOfRows);
        while ((newNoOfRows = NEW_ROW_SIZE) == lastNoOfRows);
        InitializePinkNoise(&wave->wave_right, newNoOfRows);
        lastNoOfRows = newNoOfRows;

        wave->wave_envelope_state = State_kAttack;
        wave->wave_envelope_level = 0.f;
        wave->wave_envelope_max_level = maxLevel;
        wave->wave_attack_incr = wave->wave_envelope_max_level / (attackInSeconds * (float)SR);
        wave->wave_decay_incr = - wave->wave_envelope_max_level / (attackInSeconds * 4 * (float)SR);

        wave->wave_pan_left = sqrtf(1.0f - positionLeftRight);
        wave->wave_pan_right = sqrtf(positionLeftRight);
    }
    return wave;
}